

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O0

void set_preferred_disks(vector<DiskInfo,_std::allocator<DiskInfo>_> *diskInfos,
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *disk_by_uuid)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  pointer ppVar6;
  reference __src;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  undefined1 local_648 [4];
  char local_644 [4];
  anon_struct_1296_7_5326303c disk_info_2;
  iterator __end4_2;
  iterator __begin4_2;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range4_2;
  long local_100;
  size_type pos;
  anon_struct_1296_7_5326303c *disk_info_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range4_1;
  reference local_b8;
  anon_struct_1296_7_5326303c *disk_info;
  iterator __end4;
  iterator __begin4;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_90;
  iterator it;
  allocator local_51;
  undefined1 local_50 [8];
  string device_name_s;
  bool found;
  mntent *ent;
  FILE *fstabFile;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *disk_by_uuid_local;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *diskInfos_local;
  
  lVar4 = setmntent("/etc/fstab","r");
  if (lVar4 == 0) {
    _log(__x);
  }
  else {
    while (puVar5 = (undefined8 *)getmntent(lVar4), puVar5 != (undefined8 *)0x0) {
      device_name_s.field_2._M_local_buf[0xf] = '\0';
      pcVar1 = (char *)*puVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_50,pcVar1,&local_51);
      __x_00 = (double)std::allocator<char>::~allocator((allocator<char> *)&local_51);
      _log(__x_00);
      iVar3 = strncmp("UUID=",(char *)*puVar5,5);
      if (iVar3 == 0) {
        std::__cxx11::string::substr((ulong)&it,(ulong)local_50);
        std::__cxx11::string::operator=((string *)local_50,(string *)&it);
        std::__cxx11::string::~string((string *)&it);
        local_90._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(disk_by_uuid,(key_type *)local_50);
        __range4 = (vector<DiskInfo,_std::allocator<DiskInfo>_> *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::end(disk_by_uuid);
        bVar2 = std::__detail::operator!=
                          (&local_90,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                            *)&__range4);
        if (bVar2) {
          __end4 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::begin(diskInfos);
          disk_info = (anon_struct_1296_7_5326303c *)
                      std::vector<DiskInfo,_std::allocator<DiskInfo>_>::end(diskInfos);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                                             *)&disk_info), bVar2) {
            local_b8 = __gnu_cxx::
                       __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                       ::operator*(&__end4);
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                   *)&local_90);
            if (ppVar6->second == local_b8->id) {
              local_b8->preferred = true;
              _log(__x_02);
              break;
            }
            __gnu_cxx::
            __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>::
            operator++(&__end4);
          }
        }
        else {
          _log(__x_01);
        }
      }
      else {
        iVar3 = strncmp("LABEL=",(char *)*puVar5,6);
        if (iVar3 == 0) {
          std::__cxx11::string::substr((ulong)&__range4_1,(ulong)local_50);
          std::__cxx11::string::operator=((string *)local_50,(string *)&__range4_1);
          std::__cxx11::string::~string((string *)&__range4_1);
          __end4_1 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::begin(diskInfos);
          disk_info_1 = (anon_struct_1296_7_5326303c *)
                        std::vector<DiskInfo,_std::allocator<DiskInfo>_>::end(diskInfos);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4_1,
                                    (__normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                                     *)&disk_info_1), bVar2) {
            pos = (size_type)
                  __gnu_cxx::
                  __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>::
                  operator*(&__end4_1);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50,((reference)pos)->label);
            if (bVar2) {
              *(undefined1 *)(pos + 0x50d) = 1;
              _log(__x_03);
              break;
            }
            __gnu_cxx::
            __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>::
            operator++(&__end4_1);
          }
        }
        else {
          local_100 = std::__cxx11::string::find_last_of(local_50,0x1cd08f);
          if (local_100 != -1) {
            std::__cxx11::string::substr((ulong)&__range4_2,(ulong)local_50);
            std::__cxx11::string::operator=((string *)local_50,(string *)&__range4_2);
            std::__cxx11::string::~string((string *)&__range4_2);
          }
          __end4_2 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::begin(diskInfos);
          disk_info_2._1288_8_ = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::end(diskInfos);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4_2,
                                    (__normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                                     *)(disk_info_2.label + 0xfb)), bVar2) {
            __src = __gnu_cxx::
                    __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                    ::operator*(&__end4_2);
            memcpy(local_648,__src,0x510);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50,local_644);
            if (bVar2) {
              disk_info_2.label[0xf8] = '\x01';
              _log(__x_04);
              break;
            }
            __gnu_cxx::
            __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>::
            operator++(&__end4_2);
          }
        }
      }
      std::__cxx11::string::~string((string *)local_50);
    }
    endmntent(lVar4);
  }
  return;
}

Assistant:

static void set_preferred_disks(std::vector<DiskInfo> &diskInfos, std::unordered_map<std::string, int> &disk_by_uuid) {
	FILE *fstabFile = setmntent("/etc/fstab", "r");
	if (fstabFile == nullptr) {
		LOG_DEBUG("/etc/fstab not accessible");
		return;
	}
	struct mntent *ent;
	while (nullptr != (ent = getmntent(fstabFile))) {
		bool found = false;
		std::string device_name_s(ent->mnt_fsname);
		LOG_DEBUG("found fstab entry %s ", ent->mnt_fsname);
		if (strncmp("UUID=", ent->mnt_fsname, 5) == 0) {
			// fstab entry is uuid
			device_name_s = device_name_s.substr(5);
			auto it = disk_by_uuid.find(device_name_s);
			if (it != disk_by_uuid.end()) {
				for (auto &disk_info : diskInfos) {
					if (it->second == disk_info.id) {
						disk_info.preferred = true;
						LOG_DEBUG("Disk %d device %s set as preferred", disk_info.id, disk_info.device);
						break;
					}
				}
			} else {
				LOG_DEBUG("fstab device %s found, but no corresponding diskInfo", ent->mnt_fsname);
			}
		} else if (strncmp("LABEL=", ent->mnt_fsname, 6) == 0) {
			// fstab entry is uuid
			device_name_s = device_name_s.substr(6);
			for (auto &disk_info : diskInfos) {
				if (device_name_s == disk_info.label) {
					disk_info.preferred = true;
					LOG_DEBUG("Disk %d device %s set as preferred", disk_info.id, disk_info.device);
					break;
				}
			}
		} else {
			// fstab entry is a device
			auto pos = device_name_s.find_last_of("/");
			if (pos != std::string::npos) {
				device_name_s = device_name_s.substr(pos + 1);
			}

			for (auto disk_info : diskInfos) {
				if (device_name_s == disk_info.device) {
					disk_info.preferred = true;
					LOG_DEBUG("Disk %d device %s set as preferred", disk_info.id, disk_info.device);
					break;
				}
			}
		}
	}
	endmntent(fstabFile);
	return;
}